

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O1

Iterator * __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Iterator::
operator++(Iterator *__return_storage_ptr__,Iterator *this,int param_1)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  data_node_type *pdVar5;
  int iVar6;
  Iterator *tmp;
  uint64_t uVar7;
  
  __return_storage_ptr__->cur_leaf_ = this->cur_leaf_;
  uVar1 = this->cur_idx_;
  iVar2 = this->cur_bitmap_idx_;
  __return_storage_ptr__->cur_idx_ = uVar1;
  __return_storage_ptr__->cur_bitmap_idx_ = iVar2;
  uVar7 = this->cur_bitmap_data_;
  __return_storage_ptr__->cur_bitmap_data_ = uVar7;
  if (uVar7 == 0) {
    pdVar5 = this->cur_leaf_;
    do {
      iVar6 = iVar2 + 1;
      iVar2 = iVar6;
      if (pdVar5->bitmap_size_ <= iVar6) {
        pdVar5 = pdVar5->next_leaf_;
        this->cur_leaf_ = pdVar5;
        this->cur_idx_ = 0;
        iVar2 = 0;
        if (pdVar5 == (data_node_type *)0x0) {
          this->cur_bitmap_idx_ = iVar6;
          return __return_storage_ptr__;
        }
      }
      uVar7 = pdVar5->bitmap_[iVar2];
      this->cur_bitmap_data_ = uVar7;
    } while (uVar7 == 0);
    this->cur_bitmap_idx_ = iVar2;
  }
  uVar3 = 0;
  for (uVar4 = uVar7; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x8000000000000000) {
    uVar3 = uVar3 + 1;
  }
  this->cur_idx_ = uVar3 | this->cur_bitmap_idx_ << 6;
  this->cur_bitmap_data_ = uVar7 - 1 & uVar7;
  return __return_storage_ptr__;
}

Assistant:

Iterator operator++(int) {
      Iterator tmp = *this;
      advance();
      return tmp;
    }